

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::Read3dmMaterial(ON_BinaryArchive *this,ON_Material **ppMaterial)

{
  bool bVar1;
  int iVar2;
  ON_Material *this_00;
  int iVar3;
  ON_Material *V1_material;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  
  bVar1 = Read3dmTableRecord(this,material_table,ppMaterial);
  if (!bVar1) {
    return 0;
  }
  tcode = 0;
  big_value = 0;
  if (this->m_3dm_version == 1) {
    V1_material = (ON_Material *)0x0;
    iVar2 = Read3dmV1Material(this,&V1_material);
    if (V1_material == (ON_Material *)0x0) {
      return iVar2;
    }
    bVar1 = ON_ModelComponent::IdIsNil(&V1_material->super_ON_ModelComponent);
    if (bVar1) {
      ON_ModelComponent::SetId(&V1_material->super_ON_ModelComponent);
    }
    Internal_Read3dmUpdateManifest(this,&V1_material->super_ON_ModelComponent);
    if (ppMaterial != (ON_Material **)0x0) {
      *ppMaterial = V1_material;
      return iVar2;
    }
    if (V1_material == (ON_Material *)0x0) {
      return iVar2;
    }
    (*(V1_material->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
    return iVar2;
  }
  bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
  if (!bVar1) {
    return -1;
  }
  if (tcode == 0xffffffff) {
    iVar2 = 0;
  }
  else {
    if (tcode == 0x20008040) {
      Internal_Increment3dmTableItemCount(this);
      V1_material = (ON_Material *)0x0;
      iVar2 = ReadObject(this,(ON_Object **)&V1_material);
      if (iVar2 != 0) {
        this_00 = ON_Material::Cast((ON_Object *)V1_material);
        if (this_00 != (ON_Material *)0x0) {
          bVar1 = ON_ModelComponent::IdIsNil(&this_00->super_ON_ModelComponent);
          if (bVar1) {
            ON_ModelComponent::SetId(&this_00->super_ON_ModelComponent);
          }
          Internal_Read3dmUpdateManifest(this,&this_00->super_ON_ModelComponent);
          iVar2 = 1;
          if (ppMaterial != (ON_Material **)0x0) {
            *ppMaterial = this_00;
          }
          goto LAB_003d3900;
        }
        if (V1_material != (ON_Material *)0x0) {
          (*(V1_material->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
        }
      }
      iVar2 = 0x31e2;
    }
    else {
      iVar2 = 0x31ec;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,iVar2,"","ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
    iVar2 = -1;
  }
LAB_003d3900:
  bVar1 = EndRead3dmChunk(this);
  iVar3 = -1;
  if (bVar1) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

int ON_BinaryArchive::Read3dmMaterial( ON_Material** ppMaterial )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::material_table, (void**)ppMaterial))
    return 0;

  int rc;
  ON_Material* material = nullptr;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( m_3dm_version == 1 ) 
  {
    ON_Material* V1_material = nullptr;
    rc = ON_BinaryArchive::Read3dmV1Material( &V1_material );
    if (nullptr != V1_material)
    {
      if ( V1_material->IdIsNil() )
        V1_material->SetId();
      Internal_Read3dmUpdateManifest(*V1_material);
      if (ppMaterial)
        *ppMaterial = V1_material;
      else
        delete V1_material;
    }
  }
  else 
  {
    // version 2+
    rc = -1;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_MATERIAL_RECORD ) 
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) ) 
        {
          material = ON_Material::Cast(p);
          if ( !material )
            delete p;
          else 
          {
            if ( material->IdIsNil() )
              material->SetId();
            Internal_Read3dmUpdateManifest(*material);
            if ( ppMaterial )
              *ppMaterial = material;
            rc = 1;
          }
        }
        if (!material)
        {
          ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
        }
      }
      else if ( tcode == TCODE_ENDOFTABLE ) 
      {
        // end of material table
        rc = 0;
      }
      else 
      {
        ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
      }
      if ( !EndRead3dmChunk() )
        rc = -1;
    }
  }
  return rc;
}